

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall dap::BasicTypeInfo<dap::boolean>::~BasicTypeInfo(BasicTypeInfo<dap::boolean> *this)

{
  BasicTypeInfo<dap::boolean> *this_local;
  
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}